

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BnB_JointTypeOrdering.cpp
# Opt level: O0

string * BGIP_BnB::SoftPrint_abi_cxx11_(BnB_JointTypeOrdering type)

{
  uint in_ESI;
  string *in_RDI;
  
  std::__cxx11::string::string
            ((string *)in_RDI,
             (string *)(BnB_JointTypeOrderingNames_abi_cxx11_ + (ulong)in_ESI * 0x20));
  return in_RDI;
}

Assistant:

std::string BGIP_BnB::SoftPrint(BnB_JointTypeOrdering type)
{
    return BnB_JointTypeOrderingNames[type] ;
}